

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O3

void __thiscall TestSuite::ThreadHolder::~ThreadHolder(ThreadHolder *this)

{
  ThreadFunc *pTVar1;
  _Manager_type p_Var2;
  
  join(this,true);
  p_Var2 = (this->args).func.super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    pTVar1 = &(this->args).func;
    (*p_Var2)((_Any_data *)pTVar1,(_Any_data *)pTVar1,__destroy_functor);
  }
  p_Var2 = (this->handler).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->handler,(_Any_data *)&this->handler,__destroy_functor);
  }
  return;
}

Assistant:

~ThreadHolder() { join(true); }